

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall r_comp::Preprocessor::Preprocessor(Preprocessor *this)

{
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_templateClasses)._M_h._M_buckets = &(this->m_templateClasses)._M_h._M_single_bucket;
  (this->m_templateClasses)._M_h._M_bucket_count = 1;
  (this->m_templateClasses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_templateClasses)._M_h._M_element_count = 0;
  (this->m_templateClasses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_templateClasses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_templateClasses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_28);
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

Preprocessor::Preprocessor()
{
    root = std::make_shared<RepliStruct>(RepliStruct::Root);
}